

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  secp256k1_fe *data;
  uchar *data_00;
  secp256k1_ge *data_01;
  secp256k1_fe *out32;
  uchar *in_R8;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xd;
  secp256k1_ge p;
  secp256k1_sha256 sStack_1f0;
  secp256k1_pubkey *psStack_188;
  secp256k1_ge *psStack_180;
  secp256k1_fe *psStack_178;
  secp256k1_fe *psStack_170;
  secp256k1_fe *psStack_168;
  secp256k1_fe local_150;
  secp256k1_fe local_120;
  secp256k1_fe local_f0;
  secp256k1_fe local_c0;
  secp256k1_ge local_90;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ellswift_decode_cold_4();
  }
  else if (pubkey != (secp256k1_pubkey *)0x0) {
    if (ell64 == (uchar *)0x0) {
      secp256k1_ellswift_decode_cold_2();
      return 0;
    }
    secp256k1_fe_impl_set_b32_mod(&local_f0,ell64);
    local_f0.magnitude = 1;
    local_f0.normalized = 0;
    secp256k1_fe_verify(&local_f0);
    secp256k1_fe_impl_set_b32_mod(&local_150,ell64 + 0x20);
    local_150.magnitude = 1;
    local_150.normalized = 0;
    secp256k1_fe_verify(&local_150);
    secp256k1_fe_normalize_var(&local_150);
    data = &local_150;
    secp256k1_ellswift_xswiftec_frac_var(&local_90.x,&local_c0,&local_f0,&local_150);
    secp256k1_fe_inv_var(&local_c0,&local_c0);
    data_01 = &local_90;
    secp256k1_fe_mul(&local_120,&local_90.x,&local_c0);
    out32 = &local_150;
    secp256k1_fe_verify(&local_150);
    if (local_150.normalized == 0) {
      secp256k1_ellswift_decode_cold_1();
      sStack_1f0.s[0] = 0x6a09e667;
      sStack_1f0.s[1] = 0xbb67ae85;
      sStack_1f0.s[2] = 0x3c6ef372;
      sStack_1f0.s[3] = 0xa54ff53a;
      sStack_1f0.s[4] = 0x510e527f;
      sStack_1f0.s[5] = 0x9b05688c;
      sStack_1f0.s[6] = 0x1f83d9ab;
      sStack_1f0.s[7] = 0x5be0cd19;
      sStack_1f0.bytes = 0;
      psStack_188 = pubkey;
      psStack_180 = &local_90;
      psStack_178 = &local_c0;
      psStack_170 = &local_150;
      psStack_168 = &local_f0;
      secp256k1_sha256_write(&sStack_1f0,in_R8,0x40);
      secp256k1_sha256_write(&sStack_1f0,data_00,0x40);
      secp256k1_sha256_write(&sStack_1f0,(uchar *)data,0x40);
      secp256k1_sha256_write(&sStack_1f0,(uchar *)data_01,0x20);
      secp256k1_sha256_finalize(&sStack_1f0,(uchar *)out32);
      return 1;
    }
    secp256k1_ge_set_xo_var(&local_90,&local_120,(uint)local_150.n[0] & 1);
    secp256k1_pubkey_save(pubkey,&local_90);
    return 1;
  }
  secp256k1_ellswift_decode_cold_3();
  return 0;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}